

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::PrintHello(cmServer *this,cmConnection *connection)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Value *pVVar4;
  reference ppcVar5;
  undefined4 extraout_var;
  Value local_170;
  Value local_148;
  Value local_120;
  undefined1 local_f8 [8];
  Value tmp;
  pair<int,_int> version;
  cmServerProtocol **proto;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_> *__range1;
  Value *local_80;
  Value *protocolVersions;
  Value local_68;
  undefined1 local_40 [8];
  Value hello;
  cmConnection *connection_local;
  cmServer *this_local;
  
  hello.limit_ = (ptrdiff_t)connection;
  Json::Value::Value((Value *)local_40,objectValue);
  Json::Value::Value(&local_68,"hello");
  pVVar4 = Json::Value::operator[]((Value *)local_40,&kTYPE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar4,&local_68);
  Json::Value::~Value(&local_68);
  Json::Value::Value((Value *)&__range1,arrayValue);
  pVVar4 = Json::Value::operator[]((Value *)local_40,&kSUPPORTED_PROTOCOL_VERSIONS_abi_cxx11_);
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)&__range1);
  Json::Value::~Value((Value *)&__range1);
  local_80 = pVVar4;
  __end1 = std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::begin
                     (&this->SupportedProtocols);
  proto = (cmServerProtocol **)
          std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::end
                    (&this->SupportedProtocols);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmServerProtocol_*const_*,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
                                     *)&proto), bVar1) {
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmServerProtocol_*const_*,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
              ::operator*(&__end1);
    iVar2 = (*(*ppcVar5)->_vptr_cmServerProtocol[2])();
    tmp.limit_ = CONCAT44(extraout_var,iVar2);
    Json::Value::Value((Value *)local_f8,objectValue);
    Json::Value::Value(&local_120,(Int)tmp.limit_);
    pVVar4 = Json::Value::operator[]((Value *)local_f8,&kMAJOR_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar4,&local_120);
    Json::Value::~Value(&local_120);
    Json::Value::Value(&local_148,tmp.limit_._4_4_);
    pVVar4 = Json::Value::operator[]((Value *)local_f8,&kMINOR_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar4,&local_148);
    Json::Value::~Value(&local_148);
    uVar3 = (*(*ppcVar5)->_vptr_cmServerProtocol[3])();
    if ((uVar3 & 1) != 0) {
      Json::Value::Value(&local_170,true);
      pVVar4 = Json::Value::operator[]((Value *)local_f8,&kIS_EXPERIMENTAL_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar4,&local_170);
      Json::Value::~Value(&local_170);
    }
    Json::Value::append(local_80,(Value *)local_f8);
    Json::Value::~Value((Value *)local_f8);
    __gnu_cxx::
    __normal_iterator<cmServerProtocol_*const_*,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
    ::operator++(&__end1);
  }
  WriteJsonObject(this,(cmConnection *)hello.limit_,(Value *)local_40,(DebugInfo *)0x0);
  Json::Value::~Value((Value *)local_40);
  return;
}

Assistant:

void cmServer::PrintHello(cmConnection* connection) const
{
  Json::Value hello = Json::objectValue;
  hello[kTYPE_KEY] = "hello";

  Json::Value& protocolVersions = hello[kSUPPORTED_PROTOCOL_VERSIONS] =
    Json::arrayValue;

  for (auto const& proto : this->SupportedProtocols) {
    auto version = proto->ProtocolVersion();
    Json::Value tmp = Json::objectValue;
    tmp[kMAJOR_KEY] = version.first;
    tmp[kMINOR_KEY] = version.second;
    if (proto->IsExperimental()) {
      tmp[kIS_EXPERIMENTAL_KEY] = true;
    }
    protocolVersions.append(tmp);
  }

  this->WriteJsonObject(connection, hello, nullptr);
}